

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O0

int pair1_set_recv_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool _Var1;
  int iVar2;
  int local_3c;
  int rv;
  int val;
  pair1_sock *s;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = arg;
  s._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  arg_local._4_4_ = nni_copyin_int(&local_3c,buf,sz,0,0x2000,t);
  if (arg_local._4_4_ == 0) {
    nni_mtx_lock((nni_mtx *)((long)_rv + 0x20));
    iVar2 = nni_lmq_resize((nni_lmq *)((long)_rv + 0xa8),(long)local_3c);
    _Var1 = nni_lmq_empty((nni_lmq *)((long)_rv + 0xa8));
    if (_Var1) {
      if ((*(byte *)((long)_rv + 0x128) & 1) == 0) {
        nni_pollable_clear((nni_pollable *)((long)_rv + 0x118));
      }
    }
    else {
      nni_pollable_raise((nni_pollable *)((long)_rv + 0x118));
    }
    nni_mtx_unlock((nni_mtx *)((long)_rv + 0x20));
    arg_local._4_4_ = iVar2;
  }
  return arg_local._4_4_;
}

Assistant:

static int
pair1_set_recv_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	pair1_sock *s = arg;
	int         val;
	int         rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 0, 8192, t)) != 0) {
		return (rv);
	}
	nni_mtx_lock(&s->mtx);
	rv = nni_lmq_resize(&s->rmq, (size_t) val);
	// Changing the size of the queue can affect our readiness.
	if (!nni_lmq_empty(&s->rmq)) {
		nni_pollable_raise(&s->readable);
	} else if (!s->rd_ready) {
		nni_pollable_clear(&s->readable);
	}
	nni_mtx_unlock(&s->mtx);
	return (rv);
}